

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

uint8_t av1_selectSamples(MV *mv,int *pts,int *pts_inref,int len,BLOCK_SIZE bsize)

{
  int iVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  undefined7 in_register_00000081;
  ulong uVar6;
  byte bVar7;
  
  uVar3 = CONCAT71(in_register_00000081,bsize) & 0xffffffff;
  bVar2 = block_size_high[uVar3];
  if (block_size_high[uVar3] < block_size_wide[uVar3]) {
    bVar2 = block_size_wide[uVar3];
  }
  bVar7 = 0x70;
  if (bVar2 < 0x70) {
    bVar7 = bVar2;
  }
  bVar2 = 0x10;
  if (0x10 < bVar7) {
    bVar2 = bVar7;
  }
  uVar6 = 0;
  uVar3 = (ulong)(uint)len;
  if (len < 1) {
    uVar3 = uVar6;
  }
  bVar7 = 0;
  for (; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    iVar4 = pts_inref[uVar6 * 2] - ((int)mv->col + pts[uVar6 * 2]);
    iVar1 = -iVar4;
    if (0 < iVar4) {
      iVar1 = iVar4;
    }
    iVar5 = pts_inref[uVar6 * 2 + 1] - ((int)mv->row + pts[uVar6 * 2 + 1]);
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    if ((uint)(iVar4 + iVar1) <= (uint)bVar2) {
      if (uVar6 != bVar7) {
        *(undefined8 *)(pts + (ulong)bVar7 * 2) = *(undefined8 *)(pts + uVar6 * 2);
        *(undefined8 *)(pts_inref + (ulong)bVar7 * 2) = *(undefined8 *)(pts_inref + uVar6 * 2);
      }
      bVar7 = bVar7 + 1;
    }
  }
  bVar2 = 1;
  if (1 < bVar7) {
    bVar2 = bVar7;
  }
  return bVar2;
}

Assistant:

uint8_t av1_selectSamples(MV *mv, int *pts, int *pts_inref, int len,
                          BLOCK_SIZE bsize) {
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int thresh = clamp(AOMMAX(bw, bh), 16, 112);
  uint8_t ret = 0;
  assert(len <= LEAST_SQUARES_SAMPLES_MAX);

  // Only keep the samples with MV differences within threshold.
  for (int i = 0; i < len; ++i) {
    const int diff = abs(pts_inref[2 * i] - pts[2 * i] - mv->col) +
                     abs(pts_inref[2 * i + 1] - pts[2 * i + 1] - mv->row);
    if (diff > thresh) continue;
    if (ret != i) {
      memcpy(pts + 2 * ret, pts + 2 * i, 2 * sizeof(pts[0]));
      memcpy(pts_inref + 2 * ret, pts_inref + 2 * i, 2 * sizeof(pts_inref[0]));
    }
    ++ret;
  }
  // Keep at least 1 sample.
  return AOMMAX(ret, 1);
}